

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O3

long ParseCommandLine(char *args,int *argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (argv == (char **)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = *argv;
  }
  lVar2 = 0;
  do {
    pcVar7 = args + -1;
    do {
      pcVar6 = pcVar7;
      pcVar4 = args;
      cVar5 = *pcVar4;
      args = pcVar4 + 1;
      if (' ' < cVar5) break;
      pcVar7 = pcVar6 + 1;
    } while (cVar5 != '\0');
    if (cVar5 == '\"') {
      pcVar7 = pcVar1;
      pcVar4 = args;
      if (argv != (char **)0x0) {
        argv[lVar2] = pcVar1;
      }
      do {
        cVar5 = *pcVar4;
        args = pcVar4;
        if (cVar5 != '\0') {
          args = pcVar4 + 1;
          if (cVar5 == '\"') {
            cVar5 = '\0';
          }
          else if ((cVar5 == '\\') && (*args == '\"')) {
            args = pcVar4 + 2;
            cVar5 = '\"';
          }
        }
        if (argv != (char **)0x0) {
          *pcVar7 = cVar5;
        }
        pcVar7 = pcVar7 + 1;
        pcVar4 = args;
      } while (cVar5 != '\0');
    }
    else {
      if (cVar5 == '\0') {
        if (argc != (int *)0x0) {
          *argc = (int)lVar2;
        }
        return (long)pcVar1;
      }
      pcVar7 = pcVar1 + 1;
      args = pcVar4;
      do {
        pcVar3 = args;
        args = pcVar3 + 1;
        pcVar7 = pcVar7 + 1;
        if (pcVar3[1] < '!') break;
      } while (pcVar3[1] != '\"');
      if (argv != (char **)0x0) {
        argv[lVar2] = pcVar1;
        if (pcVar4 < args) {
          do {
            pcVar7 = pcVar6 + 1;
            pcVar6 = pcVar6 + 1;
            *pcVar1 = *pcVar7;
            pcVar1 = pcVar1 + 1;
          } while (pcVar6 < pcVar3);
        }
        *pcVar1 = '\0';
        pcVar7 = pcVar1 + 1;
      }
    }
    lVar2 = lVar2 + 1;
    pcVar1 = pcVar7;
  } while( true );
}

Assistant:

static long ParseCommandLine (const char *args, int *argc, char **argv)
{
	int count;
	char *buffplace;

	count = 0;
	buffplace = NULL;
	if (argv != NULL)
	{
		buffplace = argv[0];
	}

	for (;;)
	{
		while (*args <= ' ' && *args)
		{ // skip white space
			args++;
		}
		if (*args == 0)
		{
			break;
		}
		else if (*args == '\"')
		{ // read quoted string
			char stuff;
			if (argv != NULL)
			{
				argv[count] = buffplace;
			}
			count++;
			args++;
			do
			{
				stuff = *args++;
				if (stuff == '\\' && *args == '\"')
				{
					stuff = '\"', args++;
				}
				else if (stuff == '\"')
				{
					stuff = 0;
				}
				else if (stuff == 0)
				{
					args--;
				}
				if (argv != NULL)
				{
					*buffplace = stuff;
				}
				buffplace++;
			} while (stuff);
		}
		else
		{ // read unquoted string
			const char *start = args++, *end;

			while (*args && *args > ' ' && *args != '\"')
				args++;
			end = args;
			if (argv != NULL)
			{
				argv[count] = buffplace;
				while (start < end)
					*buffplace++ = *start++;
				*buffplace++ = 0;
			}
			else
			{
				buffplace += end - start + 1;
			}
			count++;
		}
	}
	if (argc != NULL)
	{
		*argc = count;
	}
	return (long)(buffplace - (char *)0);
}